

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpen.c
# Opt level: O3

fillpen_t *
fillpen_init(dict_t *dict,char *file,float64 silprob,float64 fillprob,float64 lw,float64 wip,
            logmath_t *logmath)

{
  int32 iVar1;
  int32 iVar2;
  s3wid_t sVar3;
  fillpen_t *pfVar4;
  int32 *piVar5;
  FILE *__stream;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  s3wid_t *psVar9;
  int iVar10;
  long lVar11;
  char line [1024];
  char wd [1024];
  float64 local_840;
  char local_838 [1024];
  char local_438 [1032];
  
  pfVar4 = (fillpen_t *)
           __ckd_calloc__(1,0x30,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                          ,0x5c);
  pfVar4->dict = dict;
  pfVar4->lw = lw;
  pfVar4->wip = wip;
  pfVar4->silprob = silprob;
  pfVar4->fillerprob = fillprob;
  iVar10 = dict->filler_start;
  iVar8 = dict->filler_end;
  if (iVar8 < iVar10) {
    piVar5 = (int32 *)0x0;
  }
  else {
    piVar5 = (int32 *)__ckd_calloc__((long)((iVar8 - iVar10) + 1),4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
                                     ,0x66);
    iVar10 = dict->filler_start;
    iVar8 = dict->filler_end;
  }
  pfVar4->prob = piVar5;
  if (iVar10 <= iVar8) {
    lVar11 = (long)iVar10;
    iVar10 = iVar10 + -1;
    do {
      iVar1 = logs3(logmath,fillprob);
      iVar2 = logs3(logmath,wip);
      pfVar4->prob[lVar11 - dict->filler_start] = (int)((double)iVar1 * (double)lw + (double)iVar2);
      iVar10 = iVar10 + 1;
      lVar11 = lVar11 + 1;
    } while (iVar10 < dict->filler_end);
  }
  sVar3 = dict_wordid(dict,"<sil>");
  if (((-1 < sVar3) && (dict->filler_start <= sVar3)) && (sVar3 <= dict->filler_end)) {
    local_840 = silprob;
    iVar1 = logs3(logmath,silprob);
    iVar2 = logs3(logmath,wip);
    pfVar4->prob[(long)sVar3 - (long)dict->filler_start] =
         (int)((double)iVar1 * (double)lw + (double)iVar2);
    if (file != (char *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
              ,0x7d,"Reading filler penalty file: %s\n",file);
      __stream = fopen(file,"r");
      if (__stream == (FILE *)0x0) {
        pcVar6 = "fopen(%s,r) failed\n";
        lVar11 = 0x7f;
        goto LAB_0010e1ea;
      }
      pcVar6 = fgets(local_838,0x400,__stream);
      if (pcVar6 != (char *)0x0) {
        do {
          if (local_838[0] != '#') {
            uVar7 = __isoc99_sscanf(local_838,"%s %lf",local_438,&local_840);
            if ((uVar7 & 0xfffffffd) != 0) {
              pcVar6 = "Bad input line: %s\n";
              file = local_838;
              lVar11 = 0x86;
              goto LAB_0010e1ea;
            }
            sVar3 = dict_wordid(dict,local_438);
            if (((sVar3 < 0) || (sVar3 < dict->filler_start)) || (dict->filler_end < sVar3)) {
              pcVar6 = "%s not a filler word in the given dictionary\n";
              file = "<sil>";
              lVar11 = 0x8b;
              goto LAB_0010e1ea;
            }
            iVar1 = logs3(logmath,local_840);
            iVar2 = logs3(logmath,wip);
            pfVar4->prob[(long)sVar3 - (long)dict->filler_start] =
                 (int)((double)iVar1 * (double)lw + (double)iVar2);
          }
          pcVar6 = fgets(local_838,0x400,__stream);
        } while (pcVar6 != (char *)0x0);
      }
      fclose(__stream);
      iVar10 = dict->filler_start;
      iVar8 = dict->filler_end;
      if (iVar10 <= iVar8) {
        lVar11 = (long)iVar10 + -1;
        psVar9 = &dict->word[iVar10].basewid;
        do {
          if (iVar10 != *psVar9) {
            pfVar4->prob[(lVar11 + 1) - (long)dict->filler_start] =
                 pfVar4->prob[(long)*psVar9 - (long)dict->filler_start];
            iVar8 = dict->filler_end;
          }
          lVar11 = lVar11 + 1;
          iVar10 = iVar10 + 1;
          psVar9 = psVar9 + 8;
        } while (lVar11 < iVar8);
      }
    }
    return pfVar4;
  }
  pcVar6 = "%s not a filler word in the given dictionary\n";
  file = "<sil>";
  lVar11 = 0x74;
LAB_0010e1ea:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fillpen.c"
          ,lVar11,pcVar6,file);
  exit(1);
}

Assistant:

fillpen_t *
fillpen_init(dict_t * dict, const char *file, float64 silprob, float64 fillprob,
             float64 lw, float64 wip, logmath_t *logmath)
{
    s3wid_t w, bw;
    float64 prob;
    FILE *fp;
    char line[1024], wd[1024];
    int32 k;
    fillpen_t *_fillpen;

    _fillpen = (fillpen_t *) ckd_calloc(1, sizeof(fillpen_t));

    _fillpen->dict = dict;
    _fillpen->lw = lw;
    _fillpen->wip = wip;
    _fillpen->silprob = silprob;
    _fillpen->fillerprob = fillprob;
    if (dict->filler_end >= dict->filler_start)
        _fillpen->prob =
            (int32 *) ckd_calloc(dict->filler_end - dict->filler_start + 1,
                                 sizeof(int32));
    else
        _fillpen->prob = NULL;

    /* Initialize all words with filler penalty (HACK!! backward compatibility) */
    prob = fillprob;
    for (w = dict->filler_start; w <= dict->filler_end; w++)
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite silence penalty (HACK!! backward compatibility) */
    w = dict_wordid(dict, S3_SILENCE_WORD);
    if (NOT_S3WID(w) || (w < dict->filler_start) || (w > dict->filler_end))
        E_FATAL("%s not a filler word in the given dictionary\n",
                S3_SILENCE_WORD);
    prob = silprob;
    _fillpen->prob[w - dict->filler_start] =
        (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));

    /* Overwrite with filler prob input file, if specified */
    if (!file)
        return _fillpen;

    E_INFO("Reading filler penalty file: %s\n", file);
    if ((fp = fopen(file, "r")) == NULL)
        E_FATAL("fopen(%s,r) failed\n", file);
    while (fgets(line, sizeof(line), fp) != NULL) {
        if (line[0] == '#')     /* Skip comment lines */
            continue;

        k = sscanf(line, "%s %lf", wd, &prob);
        if ((k != 0) && (k != 2))
            E_FATAL("Bad input line: %s\n", line);
        w = dict_wordid(dict, wd);
        if (NOT_S3WID(w) || (w < dict->filler_start)
            || (w > dict->filler_end))
            E_FATAL("%s not a filler word in the given dictionary\n",
                    S3_SILENCE_WORD);

        _fillpen->prob[w - dict->filler_start] =
            (int32) ((logs3(logmath, prob) * lw + logs3(logmath, wip)));
    }
    fclose(fp);

    /* Replicate fillpen values for alternative pronunciations */
    for (w = dict->filler_start; w <= dict->filler_end; w++) {
        bw = dict_basewid(dict, w);
        if (bw != w)
            _fillpen->prob[w - dict->filler_start] =
                _fillpen->prob[bw - dict->filler_start];
    }

    return _fillpen;
}